

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_generate_random_int(uECC_word_t *random,uECC_word_t *top,wordcount_t num_words)

{
  cmpresult_t cVar1;
  bitcount_t bVar2;
  int iVar3;
  uECC_word_t uVar4;
  ulong uStack_38;
  bitcount_t num_bits;
  uECC_word_t tries;
  uECC_word_t mask;
  wordcount_t num_words_local;
  uECC_word_t *top_local;
  uECC_word_t *random_local;
  
  bVar2 = uECC_vli_numBits(top,num_words);
  if (g_rng_function != (uECC_RNG_Function)0x0) {
    for (uStack_38 = 0; uStack_38 < 0x40; uStack_38 = uStack_38 + 1) {
      iVar3 = (*g_rng_function)((uint8_t *)random,(int)num_words << 3);
      if (iVar3 == 0) {
        return 0;
      }
      random[num_words + -1] =
           0xffffffffffffffffU >> (-(char)bVar2 & 0x3fU) & random[num_words + -1];
      uVar4 = uECC_vli_isZero(random,num_words);
      if ((uVar4 == 0) && (cVar1 = uECC_vli_cmp(top,random,num_words), cVar1 == '\x01')) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

uECC_VLI_API int uECC_generate_random_int(uECC_word_t *random,
                                          const uECC_word_t *top,
                                          wordcount_t num_words) {
    uECC_word_t mask = (uECC_word_t)-1;
    uECC_word_t tries;
    bitcount_t num_bits = uECC_vli_numBits(top, num_words);

    if (!g_rng_function) {
        return 0;
    }

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!g_rng_function((uint8_t *)random, num_words * uECC_WORD_SIZE)) {
            return 0;
	    }
        random[num_words - 1] &= mask >> ((bitcount_t)(num_words * uECC_WORD_SIZE * 8 - num_bits));
        if (!uECC_vli_isZero(random, num_words) &&
		        uECC_vli_cmp(top, random, num_words) == 1) {
            return 1;
        }
    }
    return 0;
}